

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.cc
# Opt level: O2

FeatureSet * __thiscall
google::protobuf::internal::InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet
          (FeatureSet *__return_storage_ptr__,InternalFeatureHelper *this,string_view data,
          Edition edition)

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  Nonnull<std::string_*> dest;
  string_view src;
  string_view data_00;
  string unescaped_data;
  LogMessageFatal local_c0;
  StatusOr<google::protobuf::FeatureSet> edition_feature_set;
  FeatureSetDefaults defaults;
  
  dest = (Nonnull<std::string_*>)data._M_str;
  FeatureSetDefaults::FeatureSetDefaults(&defaults);
  unescaped_data._M_dataplus._M_p = (pointer)&unescaped_data.field_2;
  unescaped_data._M_string_length = 0;
  unescaped_data.field_2._M_local_buf[0] = '\0';
  src._M_str = (char *)&unescaped_data;
  src._M_len = data._M_len;
  absl::lts_20250127::Base64Unescape((lts_20250127 *)this,src,dest);
  data_00._M_str = unescaped_data._M_dataplus._M_p;
  data_00._M_len = unescaped_data._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&defaults,data_00);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&edition_feature_set,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
               ,0x15,"defaults.ParseFromString(unescaped_data)");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&edition_feature_set);
  }
  GetEditionFeatureSetDefaults(&edition_feature_set,(Edition)data._M_str,&defaults);
  if (edition_feature_set.super_StatusOrData<google::protobuf::FeatureSet>.field_0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::EnsureOk
              (&edition_feature_set.super_StatusOrData<google::protobuf::FeatureSet>);
    FeatureSet::FeatureSet
              (__return_storage_ptr__,
               &edition_feature_set.super_StatusOrData<google::protobuf::FeatureSet>.field_1.data_);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::~StatusOrData
              (&edition_feature_set.super_StatusOrData<google::protobuf::FeatureSet>);
    std::__cxx11::string::~string((string *)&unescaped_data);
    FeatureSetDefaults::~FeatureSetDefaults(&defaults);
    return __return_storage_ptr__;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)&edition_feature_set,
                           "edition_feature_set is OK");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
             ,0x17,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_c0);
}

Assistant:

FeatureSet InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet(
    absl::string_view data, Edition edition) {
  FeatureSetDefaults defaults;
  std::string unescaped_data;
  absl::Base64Unescape(data, &unescaped_data);
  ABSL_CHECK(defaults.ParseFromString(unescaped_data));
  auto edition_feature_set = GetEditionFeatureSetDefaults(edition, defaults);
  ABSL_CHECK_OK(edition_feature_set);
  return *edition_feature_set;
}